

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O0

void test_msg_body_uint16(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err nVar3;
  char *pcVar4;
  size_t sVar5;
  void *__s1;
  char *pcVar6;
  nng_err result__13;
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  uint8_t data [6];
  uint16_t v;
  nng_msg *msg;
  
  result__1 = 0x2000100;
  result_._0_2_ = 0x300;
  nVar1 = nng_msg_alloc((nng_msg **)data,0);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x11e,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar4,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_append_u16(_data,2);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x120,"%s: expected success, got %s (%d)","nng_msg_append_u16(msg, 2)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_insert_u16(_data,1);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x121,"%s: expected success, got %s (%d)","nng_msg_insert_u16(msg, 1)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_append_u16(_data,3);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x122,"%s: expected success, got %s (%d)","nng_msg_append_u16(msg, 3)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_insert_u16(_data,0);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x123,"%s: expected success, got %s (%d)","nng_msg_insert_u16(msg, 0)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_trim_u16(_data,(uint16_t *)((long)&result_ + 2));
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x124,"%s: expected success, got %s (%d)","nng_msg_trim_u16(msg, &v)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = acutest_check_((uint)(result_._2_2_ == NNG_OK >> 0x10),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x125,"%s","v == 0");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  sVar5 = nng_msg_len(_data);
  iVar2 = acutest_check_((uint)(sVar5 == 6),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x126,"%s","nng_msg_len(msg) == sizeof(data)");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  __s1 = nng_msg_body(_data);
  iVar2 = memcmp(__s1,&result__1,6);
  iVar2 = acutest_check_((uint)(iVar2 == 0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x127,"%s","memcmp(nng_msg_body(msg), data, sizeof(data)) == 0");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_trim_u16(_data,(uint16_t *)((long)&result_ + 2));
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x128,"%s: expected success, got %s (%d)","nng_msg_trim_u16(msg, &v)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = acutest_check_((uint)(result_._2_2_ == 1),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x129,"%s","v == 1");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_chop_u16(_data,(uint16_t *)((long)&result_ + 2));
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x12a,"%s: expected success, got %s (%d)","nng_msg_chop_u16(msg, &v)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = acutest_check_((uint)(result_._2_2_ == 3),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,299,"%s","v == 3");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_trim_u16(_data,(uint16_t *)((long)&result_ + 2));
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,300,"%s: expected success, got %s (%d)","nng_msg_trim_u16(msg, &v)",pcVar4
                         ,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = acutest_check_((uint)(result_._2_2_ == 2),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x12d,"%s","v == 2");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar3 = nng_msg_trim_u16(_data,(uint16_t *)((long)&result_ + 2));
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar3 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                 ,0x12e,"%s fails with %s","nng_msg_trim_u16(msg, &v)",pcVar4,nVar1);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar6 = nng_strerror(nVar3);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_msg_trim_u16(msg, &v)",pcVar4,3,pcVar6,
                   (ulong)nVar3);
  nVar1 = nng_msg_chop_u16(_data,(uint16_t *)((long)&result_ + 2));
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar1 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                 ,0x12f,"%s fails with %s","nng_msg_chop_u16(msg, &v)",pcVar4);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar6 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_msg_chop_u16(msg, &v)",pcVar4,3,pcVar6,
                   (ulong)nVar1);
  nng_msg_clear(_data);
  nVar1 = nng_msg_append(_data,(byte *)((long)&result_ + 2),1);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x132,"%s: expected success, got %s (%d)","nng_msg_append(msg, &v, 1)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar3 = nng_msg_trim_u16(_data,(uint16_t *)((long)&result_ + 2));
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar3 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                 ,0x133,"%s fails with %s","nng_msg_trim_u16(msg, &v)",pcVar4,nVar1);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar6 = nng_strerror(nVar3);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_msg_trim_u16(msg, &v)",pcVar4,3,pcVar6,
                   (ulong)nVar3);
  nVar1 = nng_msg_chop_u16(_data,(uint16_t *)((long)&result_ + 2));
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar1 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                 ,0x134,"%s fails with %s","nng_msg_chop_u16(msg, &v)",pcVar4);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar6 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_msg_chop_u16(msg, &v)",pcVar4,3,pcVar6,
                   (ulong)nVar1);
  nng_msg_free(_data);
  return;
}

Assistant:

void
test_msg_body_uint16(void)
{
	nng_msg *msg;
	uint16_t v;
	uint8_t  data[] = { 0, 1, 0, 2, 0, 3 };

	NUTS_PASS(nng_msg_alloc(&msg, 0));

	NUTS_PASS(nng_msg_append_u16(msg, 2));
	NUTS_PASS(nng_msg_insert_u16(msg, 1));
	NUTS_PASS(nng_msg_append_u16(msg, 3));
	NUTS_PASS(nng_msg_insert_u16(msg, 0));
	NUTS_PASS(nng_msg_trim_u16(msg, &v));
	NUTS_ASSERT(v == 0);
	NUTS_ASSERT(nng_msg_len(msg) == sizeof(data));
	NUTS_ASSERT(memcmp(nng_msg_body(msg), data, sizeof(data)) == 0);
	NUTS_PASS(nng_msg_trim_u16(msg, &v));
	NUTS_ASSERT(v == 1);
	NUTS_PASS(nng_msg_chop_u16(msg, &v));
	NUTS_ASSERT(v == 3);
	NUTS_PASS(nng_msg_trim_u16(msg, &v));
	NUTS_ASSERT(v == 2);
	NUTS_FAIL(nng_msg_trim_u16(msg, &v), NNG_EINVAL);
	NUTS_FAIL(nng_msg_chop_u16(msg, &v), NNG_EINVAL);

	nng_msg_clear(msg);
	NUTS_PASS(nng_msg_append(msg, &v, 1));
	NUTS_FAIL(nng_msg_trim_u16(msg, &v), NNG_EINVAL);
	NUTS_FAIL(nng_msg_chop_u16(msg, &v), NNG_EINVAL);

	nng_msg_free(msg);
}